

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::erase_check(base_checker<phmap::btree_set<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
              *this,key_type *key)

{
  btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *this_00;
  btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
  *this_01;
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  bool bVar2;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  iterator iVar6;
  iterator iVar7;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  undefined1 local_80 [8];
  int local_78;
  undefined4 uStack_74;
  AssertHelper local_70;
  undefined1 local_68 [8];
  int local_60;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  local_38;
  
  cVar4 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::find<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  cVar5 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)this);
  bVar2 = cVar4.node == cVar5.node;
  bVar3 = cVar4.position == cVar5.position;
  local_48[0] = bVar3 && bVar2;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3 || !bVar2) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_48,(AssertionResult *)0x2d474f,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x99,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_80 !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  iVar6 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::find<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  local_48 = (undefined1  [8])iVar6.node;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_40._4_4_,iVar6.position);
  cVar4 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)this->const_tree_);
  local_80 = (undefined1  [8])cVar4.node;
  local_78 = cVar4.position;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>const,std::pair<int,int>const&,std::pair<int,int>const*>>
            ((internal *)local_68,"tree_.find(key)","const_tree_.end()",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
              *)local_48,
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
              *)local_80);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_5c,local_60) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(uStack_5c,local_60);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,local_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,local_60));
  }
  this_00 = (btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
             *)this->const_tree_;
  cVar4 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::find<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this_00,key);
  cVar5 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::end(this_00);
  bVar2 = cVar4.node == cVar5.node;
  bVar3 = cVar4.position == cVar5.position;
  local_48[0] = bVar3 && bVar2;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar3 || !bVar2) {
    testing::Message::Message((Message *)local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_48,
               (AssertionResult *)"const_tree_.contains(key)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9b,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&local_58) {
      operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
    }
    if (local_80 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_80 + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  cVar4 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::find<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this->const_tree_,key);
  local_48 = (undefined1  [8])cVar4.node;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_40._4_4_,cVar4.position);
  iVar6 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)this);
  local_80 = (undefined1  [8])iVar6.node;
  local_78 = iVar6.position;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>const,std::pair<int,int>const&,std::pair<int,int>const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>>
            ((internal *)local_68,"const_tree_.find(key)","tree_.end()",
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
              *)local_48,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
              *)local_80);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if ((undefined8 *)CONCAT44(uStack_5c,local_60) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(uStack_5c,local_60);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,local_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,local_60));
  }
  iVar6 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::lower_bound<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  iVar7 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::upper_bound<std::pair<int,int>>
                    ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                      *)this,key);
  local_58._M_allocated_capacity = (size_type)iVar7.node;
  local_58._8_4_ = iVar7.position;
  this_01 = (btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
             *)this->const_tree_;
  local_68 = (undefined1  [8])iVar6.node;
  local_60 = iVar6.position;
  cVar4 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::lower_bound<std::pair<int,int>>(this_01,key);
  cVar5 = btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          ::upper_bound<std::pair<int,int>>(this_01,key);
  local_38.node = cVar5.node;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_40._4_4_,cVar4.position);
  local_38.position = cVar5.position;
  local_48 = (undefined1  [8])cVar4.node;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>,std::pair<int,int>&,std::pair<int,int>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>const,std::pair<int,int>const&,std::pair<int,int>const*>>
            ((internal *)local_80,"tree_.equal_range(key).first",
             "const_tree_.equal_range(key).second",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
              *)local_68,&local_38);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if ((undefined8 *)CONCAT44(uStack_74,local_78) == (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(uStack_74,local_78);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x9e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_48,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_74,local_78) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_74,local_78));
  }
  return;
}

Assistant:

void erase_check(const key_type &key) {
        EXPECT_FALSE(tree_.contains(key));
        EXPECT_EQ(tree_.find(key), const_tree_.end());
        EXPECT_FALSE(const_tree_.contains(key));
        EXPECT_EQ(const_tree_.find(key), tree_.end());
        EXPECT_EQ(tree_.equal_range(key).first,
                  const_tree_.equal_range(key).second);
    }